

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_no_mac.c
# Opt level: O1

int32_t ll_packet_recv(uint16_t num_timeout_symbols,uint8_t *buf,uint16_t len,
                      uint8_t *bytes_received)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  undefined6 in_register_00000012;
  uint8_t buff [2];
  ushort local_a;
  
  iVar2 = -0x65;
  if (bytes_received != (uint8_t *)0x0 &&
      ((int)CONCAT62(in_register_00000012,len) != 0 && buf != (uint8_t *)0x0)) {
    local_a = num_timeout_symbols << 8 | num_timeout_symbols >> 8;
    iVar1 = hal_read_write(OP_PKT_RECV,(uint8_t *)&local_a,2,buf,len);
    iVar3 = 0;
    if (0 < iVar1) {
      iVar3 = iVar1;
    }
    iVar2 = 0;
    if (iVar1 < 0) {
      iVar2 = iVar1;
    }
    *bytes_received = (uint8_t)iVar3;
  }
  return iVar2;
}

Assistant:

int32_t ll_packet_recv(uint16_t num_timeout_symbols, uint8_t buf[], uint16_t len, uint8_t *bytes_received)
{
    uint8_t buff[2];
    int32_t rw_response;

    if (buf == NULL || len <= 0 || bytes_received == NULL)
    {
        return LL_IFC_ERROR_INCORRECT_PARAMETER;
    }

    // Make the uint16_t value big-endian
    buff[0] = (num_timeout_symbols >> 8) & 0xFF;
    buff[1] = (num_timeout_symbols >> 0) & 0xFF;

    rw_response = hal_read_write(OP_PKT_RECV, buff, sizeof(num_timeout_symbols), buf, len);

    if (rw_response < 0)
    {
        *bytes_received = 0;
        return rw_response;
    }
    else
    {
        *bytes_received = (uint8_t) (rw_response & 0xFF);
        return(0);
    }
}